

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.h
# Opt level: O3

void __thiscall CVmObjClass::register_meta(CVmObjClass *this,vm_obj_id_t self)

{
  uint uVar1;
  
  uVar1 = *(uint *)(this->super_CVmObject).ext_;
  if (((ulong)uVar1 < G_meta_table_X->count_) && (G_meta_table_X->table_ != (vm_meta_entry_t *)0x0))
  {
    G_meta_table_X->table_[(int)uVar1].class_obj_ = self;
  }
  return;
}

Assistant:

vm_intcls_ext *get_ext() const { return (vm_intcls_ext *)ext_; }